

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_86(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  string utf8_val;
  QPDFObjectHandle h;
  string result;
  string utf16_val;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 *local_60;
  size_t local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined4 *local_40;
  size_t local_38;
  undefined4 local_30;
  uint uStack_2c;
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\x1f","");
  local_30 = 0x1f00fffe;
  local_38 = 4;
  uStack_2c = uStack_2c & 0xffffff00;
  local_58 = 0;
  local_50 = 0;
  local_60 = &local_50;
  local_40 = &local_30;
  cVar1 = QUtil::utf8_to_ascii((string *)&local_90,(string *)&local_60,'?');
  if (cVar1 == '\0') {
    __assert_fail("QUtil::utf8_to_ascii(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc15,"void test_86(QPDF &, const char *)");
  }
  if (local_58 != local_88) {
LAB_0013b4ef:
    __assert_fail("result == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc16,"void test_86(QPDF &, const char *)");
  }
  if (local_58 != 0) {
    iVar2 = bcmp(local_60,local_90,local_58);
    if (iVar2 != 0) goto LAB_0013b4ef;
  }
  cVar1 = QUtil::utf8_to_pdf_doc((string *)&local_90,(string *)&local_60,'?');
  if (cVar1 != '\0') {
    __assert_fail("!QUtil::utf8_to_pdf_doc(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc17,"void test_86(QPDF &, const char *)");
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar2 != 0) {
    __assert_fail("result == \"?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc18,"void test_86(QPDF &, const char *)");
  }
  QUtil::utf8_to_utf16((string *)&local_b0);
  if (local_a8 != local_38) {
LAB_0013b50e:
    __assert_fail("QUtil::utf8_to_utf16(utf8_val) == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc19,"void test_86(QPDF &, const char *)");
  }
  if (local_a8 != 0) {
    iVar2 = bcmp(local_b0,local_40,local_a8);
    if (iVar2 != 0) goto LAB_0013b50e;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  QUtil::utf16_to_utf8((string *)&local_b0);
  if (local_a8 != local_88) {
LAB_0013b52d:
    __assert_fail("QUtil::utf16_to_utf8(utf16_val) == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1a,"void test_86(QPDF &, const char *)");
  }
  if (local_a8 != 0) {
    iVar2 = bcmp(local_b0,local_90,local_a8);
    if (iVar2 != 0) goto LAB_0013b52d;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  QPDFObjectHandle::newUnicodeString(local_70);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (local_a8 != local_38) {
LAB_0013b54c:
    __assert_fail("h.getStringValue() == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1c,"void test_86(QPDF &, const char *)");
  }
  if (local_a8 != 0) {
    iVar2 = bcmp(local_b0,local_40,local_a8);
    if (iVar2 != 0) goto LAB_0013b54c;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  if (local_a8 == local_88) {
    if (local_a8 != 0) {
      iVar2 = bcmp(local_b0,local_90,local_a8);
      if (iVar2 != 0) goto LAB_0013b56b;
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    if (local_40 != &local_30) {
      operator_delete(local_40,CONCAT44(uStack_2c,local_30) + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    return;
  }
LAB_0013b56b:
  __assert_fail("h.getUTF8Value() == utf8_val",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xc1d,"void test_86(QPDF &, const char *)");
}

Assistant:

static void
test_0_1(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle trailer = pdf.getTrailer();
    QPDFObjectHandle qtest = trailer.getKey("/QTest");

    if (!trailer.hasKey("/QTest")) {
        // This will always happen when /QTest is null because
        // hasKey returns false for null keys regardless of
        // whether the key exists or not.  That way there's never
        // any difference between a key that is present and null
        // and a key that is absent.
        QTC::TC("qpdf", "main QTest implicit");
        std::cout << "/QTest is implicit" << std::endl;
    }

    QTC::TC("qpdf", "main QTest indirect", qtest.isIndirect() ? 1 : 0);
    std::cout << "/QTest is " << (qtest.isIndirect() ? "in" : "") << "direct and has type "
              << qtest.getTypeName() << " (" << qtest.getTypeCode() << ")" << std::endl;

    if (qtest.isNull()) {
        QTC::TC("qpdf", "main QTest null");
        std::cout << "/QTest is null" << std::endl;
    } else if (qtest.isBool()) {
        QTC::TC("qpdf", "main QTest bool", qtest.getBoolValue() ? 1 : 0);
        std::cout << "/QTest is Boolean with value " << (qtest.getBoolValue() ? "true" : "false")
                  << std::endl;
    } else if (qtest.isInteger()) {
        QTC::TC("qpdf", "main QTest int");
        std::cout << "/QTest is an integer with value " << qtest.getIntValue() << std::endl;
    } else if (qtest.isReal()) {
        QTC::TC("qpdf", "main QTest real");
        std::cout << "/QTest is a real number with value " << qtest.getRealValue() << std::endl;
    } else if (qtest.isName()) {
        QTC::TC("qpdf", "main QTest name");
        std::cout << "/QTest is a name with value " << qtest.getName() << std::endl;
    } else if (qtest.isString()) {
        QTC::TC("qpdf", "main QTest string");
        std::cout << "/QTest is a string with value " << qtest.getStringValue() << std::endl;
    } else if (qtest.isArray()) {
        QTC::TC("qpdf", "main QTest array");
        std::cout << "/QTest is an array with " << qtest.getArrayNItems() << " items" << std::endl;
        int i = 0;
        for (auto& iter: qtest.aitems()) {
            QTC::TC("qpdf", "main QTest array indirect", iter.isIndirect() ? 1 : 0);
            std::cout << "  item " << i << " is " << (iter.isIndirect() ? "in" : "") << "direct"
                      << std::endl;
            ++i;
        }
    } else if (qtest.isDictionary()) {
        QTC::TC("qpdf", "main QTest dictionary");
        std::cout << "/QTest is a dictionary" << std::endl;
        for (auto& iter: qtest.ditems()) {
            QTC::TC("qpdf", "main QTest dictionary indirect", iter.second.isIndirect() ? 1 : 0);
            std::cout << "  " << iter.first << " is " << (iter.second.isIndirect() ? "in" : "")
                      << "direct" << std::endl;
        }
    } else if (qtest.isStream()) {
        QTC::TC("qpdf", "main QTest stream");
        std::cout << "/QTest is a stream.  Dictionary: " << qtest.getDict().unparse() << std::endl;

        std::cout << "Raw stream data:" << std::endl;
        std::cout.flush();
        QUtil::binary_stdout();
        auto out = std::make_shared<Pl_StdioFile>("raw", stdout);
        qtest.pipeStreamData(out.get(), 0, qpdf_dl_none);

        std::cout << std::endl << "Uncompressed stream data:" << std::endl;
        if (qtest.pipeStreamData(nullptr, 0, qpdf_dl_all)) {
            std::cout.flush();
            QUtil::binary_stdout();
            out = std::make_shared<Pl_StdioFile>("filtered", stdout);
            qtest.pipeStreamData(out.get(), 0, qpdf_dl_all);
            std::cout << std::endl << "End of stream data" << std::endl;
        } else {
            std::cout << "Stream data is not filterable." << std::endl;
        }
    } else {
        // Should not happen!
        std::cout << "/QTest is an unknown object" << std::endl;
    }

    std::cout << "unparse: " << qtest.unparse() << std::endl
              << "unparseResolved: " << qtest.unparseResolved() << std::endl;
}